

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bwt_merger.hpp
# Opt level: O1

void __thiscall
bwt_merger<dna_bwt_n<dna_string_n>,_unsigned_short>::save_to_file
          (bwt_merger<dna_bwt_n<dna_string_n>,_unsigned_short> *this,string *base_path)

{
  pointer pcVar1;
  dna_bwt_n<dna_string_n> **ppdVar2;
  ulong uVar3;
  long lVar4;
  uint64_t i;
  ulong uVar5;
  uint uVar6;
  uint64_t uVar7;
  bool bVar8;
  char c;
  string lcp_path;
  string da_path;
  string bwt_path;
  ofstream out;
  byte local_2a9;
  dna_bwt_n<dna_string_n> **local_2a8;
  ulong local_2a0;
  dna_bwt_n<dna_string_n> **local_298;
  undefined1 *local_290 [2];
  undefined1 local_280 [16];
  undefined1 *local_270 [2];
  undefined1 local_260 [16];
  undefined1 *local_250 [2];
  undefined1 local_240 [16];
  ulong local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  
  local_250[0] = local_240;
  pcVar1 = (base_path->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_250,pcVar1,pcVar1 + base_path->_M_string_length);
  std::__cxx11::string::append((char *)local_250);
  local_270[0] = local_260;
  pcVar1 = (base_path->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_270,pcVar1,pcVar1 + base_path->_M_string_length);
  std::__cxx11::string::append((char *)local_270);
  local_290[0] = local_280;
  pcVar1 = (base_path->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_290,pcVar1,pcVar1 + base_path->_M_string_length);
  std::__cxx11::string::append((char *)local_290);
  std::ofstream::ofstream(&local_230,(string *)local_250,_S_out);
  if (this->n != 0) {
    uVar5 = 0;
    local_2a0 = 0x800000000000003f;
    local_2a8 = &this->bwt2;
    local_298 = &this->bwt1;
    uVar7 = 0;
    do {
      uVar3 = uVar5 + 0x3f;
      if (-1 < (long)uVar5) {
        uVar3 = uVar5;
      }
      lVar4 = ((long)uVar3 >> 6) * 8;
      uVar3 = (ulong)((uVar5 & local_2a0) < 0x8000000000000001);
      uVar6 = (uint)uVar5 & 0x3f;
      bVar8 = (*(ulong *)((long)(this->DA).super__Bvector_base<std::allocator<bool>_>._M_impl.
                                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                          lVar4 + -8 + uVar3 * 8) >> uVar6 & 1) == 0;
      ppdVar2 = local_2a8;
      if (bVar8) {
        ppdVar2 = local_298;
      }
      i = uVar5 - uVar7;
      if (!bVar8) {
        i = uVar7;
      }
      local_2a9 = dna_string_n::operator[](&(*ppdVar2)->BWT,i);
      std::ostream::write((char *)&local_230,(long)&local_2a9);
      uVar7 = uVar7 + ((*(ulong *)(uVar3 * 8 + -8 +
                                  lVar4 + (long)(this->DA).
                                                super__Bvector_base<std::allocator<bool>_>._M_impl.
                                                super__Bvector_impl_data._M_start.
                                                super__Bit_iterator_base._M_p) >> uVar6 & 1) != 0);
      uVar5 = uVar5 + 1;
    } while (uVar5 < this->n);
  }
  std::ofstream::close();
  ppdVar2 = __filebuf;
  uVar5 = _VTT;
  local_230 = _VTT;
  *(dna_bwt_n<dna_string_n> ***)(local_228 + *(long *)(_VTT - 0x18) + -8) = __filebuf;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  if (this->out_da == true) {
    local_2a8 = ppdVar2;
    local_2a0 = uVar5;
    std::ofstream::ofstream(&local_230,(string *)local_270,_S_out);
    if (this->n != 0) {
      uVar5 = 0;
      do {
        uVar3 = uVar5 + 0x3f;
        if (-1 < (long)uVar5) {
          uVar3 = uVar5;
        }
        local_2a9 = (*(ulong *)(((long)uVar3 >> 6) * 8 +
                                (long)(this->DA).super__Bvector_base<std::allocator<bool>_>._M_impl.
                                      super__Bvector_impl_data._M_start.super__Bit_iterator_base.
                                      _M_p + -8 +
                               (ulong)((uVar5 & 0x800000000000003f) < 0x8000000000000001) * 8) >>
                     (uVar5 & 0x3f) & 1) == 0 ^ 0x31;
        std::ostream::write((char *)&local_230,(long)&local_2a9);
        uVar5 = uVar5 + 1;
      } while (uVar5 < this->n);
    }
    std::ofstream::close();
    uVar5 = local_2a0;
    ppdVar2 = local_2a8;
    local_230 = local_2a0;
    *(dna_bwt_n<dna_string_n> ***)(local_228 + *(long *)(local_2a0 - 0x18) + -8) = local_2a8;
    std::filebuf::~filebuf(local_228);
    std::ios_base::~ios_base(local_138);
  }
  if ((this->LCP).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (this->LCP).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start) {
    std::ofstream::ofstream(&local_230,(string *)local_290,_S_out);
    std::ostream::write((char *)&local_230,
                        (long)(this->LCP).
                              super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                              _M_impl.super__Vector_impl_data._M_start);
    std::ofstream::close();
    local_230 = uVar5;
    *(dna_bwt_n<dna_string_n> ***)(local_228 + *(long *)(uVar5 - 0x18) + -8) = ppdVar2;
    std::filebuf::~filebuf(local_228);
    std::ios_base::~ios_base(local_138);
  }
  if (local_290[0] != local_280) {
    operator_delete(local_290[0]);
  }
  if (local_270[0] != local_260) {
    operator_delete(local_270[0]);
  }
  if (local_250[0] != local_240) {
    operator_delete(local_250[0]);
  }
  return;
}

Assistant:

void save_to_file(string base_path){

		string bwt_path = base_path;
		bwt_path.append(".bwt");

		string da_path = base_path;
		da_path.append(".da");

		string lcp_path = base_path;
		lcp_path.append(".lcp");

		{
			std::ofstream out(bwt_path);

			uint64_t rank1 = 0;
			for(uint64_t i=0;i<n;++i){

				char c = DA[i]==0 ? bwt1->operator[](i-rank1) : bwt2->operator[](rank1);

				out.write((char*)&c,sizeof(c));

				rank1 += DA[i];

			}
			out.close();
		}

		if(out_da){
			std::ofstream out(da_path);
			for(uint64_t i=0;i<n;++i){

				uint8_t c = DA[i] ? '1' : '0';
				out.write((char*)&c,sizeof(c));

			}
			out.close();
		}

		if(LCP.size()>0){

			std::ofstream out(lcp_path);

			out.write((char*)LCP.data(),LCP.size() * sizeof(lcp_int_t));

			out.close();

		}

	}